

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O3

__pid_t __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::wait(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
       *this,void *__stat_loc)

{
  _Map_pointer ppfVar1;
  recursive_mutex *__mutex;
  int iVar2;
  _Elt_pointer pfVar3;
  scoped_lock lock;
  unique_lock<boost::recursive_mutex> local_30;
  
  local_30.m = &this->m_monitor;
  local_30.is_locked = false;
  unique_lock<boost::recursive_mutex>::lock(&local_30);
  if (__stat_loc == (void *)0x0) {
    while ((this->m_active_worker_count != 0 ||
           (pfVar3 = (this->m_scheduler).m_container.
                     super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur,
           pfVar3 != (this->m_scheduler).m_container.
                     super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (&this->m_worker_idle_or_terminated_event,&local_30);
    }
  }
  else {
    while (ppfVar1 = (this->m_scheduler).m_container.
                     super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
          pfVar3 = (_Elt_pointer)
                   (((long)(this->m_scheduler).m_container.
                           super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(this->m_scheduler).m_container.
                           super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                   ((((ulong)((long)ppfVar1 -
                             (long)(this->m_scheduler).m_container.
                                   super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppfVar1 == (_Map_pointer)0x0)) * 0x10),
          __stat_loc <
          (void *)((long)&(pfVar3->super_function_base).vtable +
                  ((long)(this->m_scheduler).m_container.
                         super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(this->m_scheduler).m_container.
                         super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                  this->m_active_worker_count)) {
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (&this->m_worker_idle_or_terminated_event,&local_30);
    }
  }
  __mutex = local_30.m;
  iVar2 = (int)pfVar3;
  if (local_30.is_locked == true) {
    do {
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (iVar2 == 4);
  }
  return iVar2;
}

Assistant:

void wait(size_t const task_threshold = 0) const volatile
    {
      const pool_type* self = const_cast<const pool_type*>(this);
      recursive_mutex::scoped_lock lock(self->m_monitor);

      if(0 == task_threshold)
      {
        while(0 != self->m_active_worker_count || !self->m_scheduler.empty())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
      else
      {
        while(task_threshold < self->m_active_worker_count + self->m_scheduler.size())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
    }